

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLSTALLEDPATTERN_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_000005e8;
  double *in_stack_000005f0;
  double *in_stack_000005f8;
  double *in_stack_00000600;
  int in_stack_0000060c;
  int in_stack_00000610;
  int *in_stack_00000620;
  int *in_stack_00000628;
  int *in_stack_00000630;
  
  TVar1 = TA_CDLSTALLEDPATTERN
                    (in_stack_00000610,in_stack_0000060c,in_stack_00000600,in_stack_000005f8,
                     in_stack_000005f0,in_stack_000005e8,in_stack_00000620,in_stack_00000628,
                     in_stack_00000630);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLSTALLEDPATTERN_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLSTALLEDPATTERN(
/* Generated */                           startIdx,
/* Generated */                           endIdx,
/* Generated */                           params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                           params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                           params->in[0].data.inPrice.low, /* inLow */
/* Generated */                           params->in[0].data.inPrice.close, /* inClose */
/* Generated */                           outBegIdx, 
/* Generated */                           outNBElement, 
/* Generated */                           params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }